

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_uuid.cpp
# Opt level: O3

ON_UUID ON_UuidFromString(char *sUUID)

{
  char cVar1;
  ON_UUID OVar2;
  endian eVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  byte bVar7;
  long lVar8;
  uchar byte_value [2];
  anon_union_16_2_c96208d8 u;
  byte local_1a [2];
  ON_UUID local_18;
  
  if ((ON_UuidFromString(char_const*)::rho == '\0') &&
     (iVar5 = __cxa_guard_acquire(&ON_UuidFromString(char_const*)::rho), iVar5 != 0)) {
    eVar3 = ON::Endian();
    ON_UuidFromString::rho = little_endian_rho;
    if (eVar3 == big_endian) {
      ON_UuidFromString::rho = big_endian_rho;
    }
    __cxa_guard_release(&ON_UuidFromString(char_const*)::rho);
  }
  local_18.Data1 = 0;
  local_18.Data2 = 0;
  local_18.Data3 = 0;
  local_18.Data4[0] = '\0';
  local_18.Data4[1] = '\0';
  local_18.Data4[2] = '\0';
  local_18.Data4[3] = '\0';
  local_18.Data4[4] = '\0';
  local_18.Data4[5] = '\0';
  local_18.Data4[6] = '\0';
  local_18.Data4[7] = '\0';
  if (sUUID == (char *)0x0) {
LAB_00662901:
    local_18.Data1 = 0;
    local_18.Data2 = 0;
    local_18.Data3 = 0;
    local_18.Data4[0] = '\0';
    local_18.Data4[1] = '\0';
    local_18.Data4[2] = '\0';
    local_18.Data4[3] = '\0';
    local_18.Data4[4] = '\0';
    local_18.Data4[5] = '\0';
    local_18.Data4[6] = '\0';
    local_18.Data4[7] = '\0';
  }
  else {
    pcVar6 = sUUID + -1;
    do {
      cVar1 = pcVar6[1];
      pcVar6 = pcVar6 + 1;
      if (cVar1 == '\0') break;
    } while (cVar1 < '!');
    pcVar6 = pcVar6 + (cVar1 == '{');
    lVar4 = 0;
    do {
      local_1a[0] = 0;
      local_1a[1] = 0;
      iVar5 = 0;
      do {
        cVar1 = *pcVar6;
        if (cVar1 == '\0') goto LAB_00662901;
        if ((byte)(cVar1 + 0xbfU) < 6) {
          bVar7 = cVar1 - 0x37;
LAB_006628b8:
          lVar8 = (long)iVar5;
          iVar5 = iVar5 + 1;
          local_1a[lVar8] = bVar7;
        }
        else {
          bVar7 = cVar1 - 0x30;
          if (bVar7 < 10) goto LAB_006628b8;
          if ((byte)(cVar1 + 0x9fU) < 6) {
            bVar7 = cVar1 + 0xa9;
            goto LAB_006628b8;
          }
          if (cVar1 != '-') goto LAB_00662901;
        }
        pcVar6 = pcVar6 + 1;
      } while (iVar5 < 2);
      local_18.Data4[(long)ON_UuidFromString::rho[lVar4] + -8] = local_1a[0] * '\x10' + local_1a[1];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x10);
  }
  OVar2.Data4[0] = local_18.Data4[0];
  OVar2.Data4[1] = local_18.Data4[1];
  OVar2.Data4[2] = local_18.Data4[2];
  OVar2.Data4[3] = local_18.Data4[3];
  OVar2.Data4[4] = local_18.Data4[4];
  OVar2.Data4[5] = local_18.Data4[5];
  OVar2.Data4[6] = local_18.Data4[6];
  OVar2.Data4[7] = local_18.Data4[7];
  OVar2.Data1 = local_18.Data1;
  OVar2.Data2 = local_18.Data2;
  OVar2.Data3 = local_18.Data3;
  return OVar2;
}

Assistant:

ON_UUID ON_UuidFromString( const char* sUUID )
{
  // NOTE WELL: This code has to work on non-Windows OSs and on
  //            both big and little endian CPUs.  On Windows OSs
  //            is must return the same result as 
  //            Windows's UuidFromString().
  //

  // string has format like "85A08515-F383-11d3-BFE7-0010830122F0"
  // or like "{85A08515-F383-11d3-BFE7-0010830122F0}".  Brackets
  // and hyphens are optional and ignored.
  //
  // Windows users can use "guidgen" to create UUID strings.

  /*
#if defined(ON_DEBUG) && defined(ON_RUNTIME_WIN)
  RPC_STATUS st;
  union 
  {
    ON_UUID uuid;
    unsigned char b[16];
  } u1;
  st = UuidFromString( (unsigned char*)sUUID, &u1.uuid );
#endif
*/

  static const int* rho = (ON::endian::big_endian == ON::Endian())
                        ? big_endian_rho 
                        : little_endian_rho;

  union 
  {
    ON_UUID uuid;
    unsigned char b[16];
  } u;
  bool bFailed;
  int bi, ci;
  unsigned char c;
  unsigned char byte_value[2];

  memset(&u,0,sizeof(u));
  //for ( bi = 0; bi < 16; bi++ ) 
  //  u.b[bi] = 0;

  bFailed = sUUID ? false : true;

  if ( !bFailed ) {
    while ( *sUUID && *sUUID <= ' ' ) // skip leading white space
      sUUID++;
    if ( *sUUID == '{' )
      sUUID++;
    for ( bi = 0; bi < 16; bi++ ) {
      ci = 0;
      byte_value[0] = 0;
      byte_value[1] = 0;
      while ( ci < 2 ) {
        c = *sUUID++;
        if ( !c ) {
          bFailed = true;
          break;
        }
        if ( c >= 'A' && c <= 'F' ) {
          byte_value[ci++] = (c-'A'+10);
        }
        else if ( c >= '0' && c <='9' ) {
          byte_value[ci++] = (c-'0');
        }
        else if ( c >= 'a' && c <= 'f' ) {
          byte_value[ci++] = (c-'a'+10);
        }
        else if ( c != '-' ) {
          bFailed = true;
          break;
        }
      }
      if ( bFailed )
        break;
      u.b[rho[bi]] = 16*byte_value[0] + byte_value[1];
    }
  }

  if ( bFailed ) {
    // 09 August 2006 John Morse
    // There are times when Rhino is looking for a plug-in but the SDK or command
    // allows the plug-in to be specified by name or UUID.  Rhino calls ON_UuidFromString()
    // to see if the string is a plug-in UUID so it knows if it should be comparing the string
    // or plug-in name when looking for a plug-in.  The ON_ERROR line makes the Rhino commands
    // generate an OpenNURBS message box (in DEBUG builds) when the command completes and is
    // a pain so I commented it out per Dale Lear.
    //ON_ERROR("ON_UuidFromString(): bad string passed in");
    u.uuid = ON_nil_uuid;
  }

/*
#if defined(ON_DEBUG) && defined(ON_RUNTIME_WIN)
  if ( memcmp( &u.uuid, &u1.uuid, 16 ) ) {
    ON_ERROR("ON_UuidFromString() failed");
  }
  if ( UuidCompare( &u.uuid, &u1.uuid, &st ) ) {
    ON_ERROR("ON_UuidFromString() failed");
  }
  if ( ON_UuidCompare( &u.uuid, &u1.uuid ) ) {
    ON_ERROR("ON_UuidCompare() failed");
  }
#endif
*/
  return u.uuid;
}